

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu.cpp
# Opt level: O1

int __thiscall ncnn::ELU::forward_inplace(ELU *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  void *pvVar7;
  float fVar8;
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    pvVar7 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    lVar6 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar5 = 0;
        do {
          fVar8 = *(float *)((long)pvVar7 + uVar5 * 4);
          if (fVar8 < 0.0) {
            fVar8 = expf(fVar8);
            *(float *)((long)pvVar7 + uVar5 * 4) = (fVar8 + -1.0) * this->alpha;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      lVar6 = lVar6 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    } while (lVar6 != iVar1);
  }
  return 0;
}

Assistant:

int ELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = alpha * (expf(ptr[i]) - 1.f);
        }
    }

    return 0;
}